

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O3

int mapping0_inverse(vorbis_block *vb,vorbis_info_mapping *l)

{
  float fVar1;
  int iVar2;
  vorbis_look_floor *pvVar3;
  _func_void_ptr_vorbis_block_ptr_vorbis_look_floor_ptr *p_Var4;
  float *pfVar5;
  vorbis_look_residue *pvVar6;
  _func_int_vorbis_block_ptr_vorbis_look_residue_ptr_float_ptr_ptr_int_ptr_int *p_Var7;
  float *pfVar8;
  void *pvVar9;
  _func_int_vorbis_block_ptr_vorbis_look_floor_ptr_void_ptr_float_ptr *p_Var10;
  mdct_lookup *init;
  bool bVar11;
  vorbis_info *pvVar12;
  void *pvVar13;
  long lVar14;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  vorbis_block *pvVar22;
  int iVar23;
  float *pcmA;
  long lVar24;
  float *pcmM;
  int *piVar25;
  float **ppfVar26;
  float fVar27;
  undefined8 uStack_70;
  float *local_68;
  long local_60;
  long local_58;
  void *local_50;
  vorbis_info *local_48;
  void *local_40;
  vorbis_block *local_38;
  
  local_48 = vb->vd->vi;
  local_40 = vb->vd->backend_state;
  local_50 = local_48->codec_setup;
  local_58 = *(long *)((long)local_50 + vb->W * 8);
  vb->pcmend = (int)local_58;
  lVar14 = (long)local_48->channels;
  uVar17 = lVar14 * 8 + 0xfU & 0xfffffffffffffff0;
  ppfVar26 = (float **)((long)&local_68 - uVar17);
  uVar19 = lVar14 * 4 + 0xfU & 0xfffffffffffffff0;
  piVar25 = (int *)((long)ppfVar26 - uVar19);
  lVar20 = (long)piVar25 + (-uVar17 - uVar19);
  local_60 = lVar20;
  local_38 = vb;
  if (0 < lVar14) {
    local_68 = (float *)((ulong)((local_58 << 0x20) >> 0x1e) >> 1);
    lVar14 = 0;
    do {
      pvVar22 = local_38;
      lVar15 = (long)*(int *)((long)l + (long)*(int *)((long)l + lVar14 * 4 + 4) * 4 + 0x404);
      pvVar3 = *(vorbis_look_floor **)(*(long *)((long)local_40 + 0x58) + lVar15 * 8);
      p_Var4 = _floor_P[*(int *)((long)local_50 + lVar15 * 4 + 0x528)]->inverse1;
      *(undefined8 *)(lVar20 + -8) = 0x1e38db;
      pvVar16 = (*p_Var4)(pvVar22,pvVar3);
      *(void **)(local_60 + lVar14 * 8) = pvVar16;
      *(uint *)((long)piVar25 + (lVar14 * 4 - uVar19)) = (uint)(pvVar16 != (void *)0x0);
      pfVar8 = local_68;
      pfVar5 = local_38->pcm[lVar14];
      *(undefined8 *)(lVar20 + -8) = 0x1e3906;
      memset(pfVar5,0,(size_t)pfVar8);
      lVar14 = lVar14 + 1;
    } while (lVar14 < local_48->channels);
  }
  pvVar22 = local_38;
  pvVar16 = local_50;
  uVar21 = *(uint *)((long)l + 0x484);
  if (0 < (long)(int)uVar21) {
    lVar14 = 0;
    do {
      lVar15 = (long)*(int *)((long)l + lVar14 * 4 + 0x488);
      lVar24 = (long)*(int *)((long)l + lVar14 * 4 + 0x888);
      if ((*(int *)((long)piVar25 + (lVar15 * 4 - uVar19)) != 0) ||
         (*(int *)((long)piVar25 + (lVar24 * 4 - uVar19)) != 0)) {
        *(undefined4 *)((long)piVar25 + (lVar15 * 4 - uVar19)) = 1;
        *(undefined4 *)((long)piVar25 + (lVar24 * 4 - uVar19)) = 1;
      }
      lVar14 = lVar14 + 1;
    } while ((int)uVar21 != lVar14);
  }
  if (0 < *l) {
    uVar17 = 0;
    do {
      iVar2 = local_48->channels;
      iVar23 = 0;
      if (0 < (long)iVar2) {
        uVar18 = 0;
        iVar23 = 0;
        do {
          if (uVar17 == *(uint *)((long)l + uVar18 * 4 + 4)) {
            piVar25[iVar23] = (uint)(*(int *)((long)piVar25 + (uVar18 * 4 - uVar19)) != 0);
            ppfVar26[iVar23] = pvVar22->pcm[uVar18];
            iVar23 = iVar23 + 1;
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < (ulong)(long)iVar2);
      }
      lVar14 = (long)*(int *)((long)l + uVar17 * 4 + 0x444);
      pvVar6 = *(vorbis_look_residue **)(*(long *)((long)local_40 + 0x60) + lVar14 * 8);
      p_Var7 = _residue_P[*(int *)((long)pvVar16 + lVar14 * 4 + 0x828)]->inverse;
      *(undefined8 *)(lVar20 + -8) = 0x1e39ef;
      (*p_Var7)(pvVar22,pvVar6,ppfVar26,piVar25,iVar23);
      uVar17 = uVar17 + 1;
      pvVar22 = local_38;
      pvVar16 = local_50;
    } while ((long)uVar17 < (long)*l);
    uVar21 = *(uint *)((long)l + 0x484);
  }
  pvVar13 = local_40;
  pvVar12 = local_48;
  lVar14 = local_60;
  if (0 < (int)uVar21) {
    ppfVar26 = pvVar22->pcm;
    lVar24 = (long)(int)local_58 / 2;
    lVar15 = 1;
    if (1 < lVar24) {
      lVar15 = lVar24;
    }
    uVar17 = (ulong)uVar21;
    do {
      if (1 < (long)(int)local_58) {
        pfVar5 = ppfVar26[*(int *)((long)l + uVar17 * 4 + 0x484)];
        pfVar8 = ppfVar26[*(int *)((long)l + uVar17 * 4 + 0x884)];
        lVar24 = 0;
        do {
          fVar27 = pfVar5[lVar24];
          fVar1 = pfVar8[lVar24];
          if (fVar27 <= 0.0) {
            if (0.0 < fVar1) {
              fVar27 = fVar27 + fVar1;
              goto LAB_001e3a89;
            }
            pfVar8[lVar24] = fVar27;
            pfVar5[lVar24] = fVar27 - fVar1;
          }
          else if (fVar1 <= 0.0) {
            pfVar8[lVar24] = fVar27;
            pfVar5[lVar24] = fVar1 + fVar27;
          }
          else {
            fVar27 = fVar27 - fVar1;
LAB_001e3a89:
            pfVar8[lVar24] = fVar27;
          }
          lVar24 = lVar24 + 1;
        } while (lVar15 != lVar24);
      }
      bVar11 = 1 < (long)uVar17;
      uVar17 = uVar17 - 1;
    } while (bVar11);
  }
  if (0 < local_48->channels) {
    lVar15 = 0;
    do {
      pfVar5 = pvVar22->pcm[lVar15];
      lVar24 = (long)*(int *)((long)l + (long)*(int *)((long)l + lVar15 * 4 + 4) * 4 + 0x404);
      pvVar3 = *(vorbis_look_floor **)(*(long *)((long)pvVar13 + 0x58) + lVar24 * 8);
      pvVar9 = *(void **)(lVar14 + lVar15 * 8);
      p_Var10 = _floor_P[*(int *)((long)pvVar16 + lVar24 * 4 + 0x528)]->inverse2;
      *(undefined8 *)(lVar20 + -8) = 0x1e3b15;
      (*p_Var10)(pvVar22,pvVar3,pvVar9,pfVar5);
      lVar15 = lVar15 + 1;
      iVar2 = pvVar12->channels;
      pvVar22 = local_38;
      pvVar16 = local_50;
    } while (lVar15 < iVar2);
    if (0 < iVar2) {
      lVar14 = 0;
      do {
        pfVar5 = local_38->pcm[lVar14];
        init = (mdct_lookup *)**(undefined8 **)((long)pvVar13 + local_38->W * 8 + 0x10);
        *(undefined8 *)(lVar20 + -8) = 0x1e3b4b;
        mdct_backward(init,pfVar5,pfVar5);
        lVar14 = lVar14 + 1;
      } while (lVar14 < pvVar12->channels);
    }
  }
  return 0;
}

Assistant:

static int mapping0_inverse(vorbis_block *vb,vorbis_info_mapping *l){
  vorbis_dsp_state     *vd=vb->vd;
  vorbis_info          *vi=vd->vi;
  codec_setup_info     *ci=vi->codec_setup;
  private_state        *b=vd->backend_state;
  vorbis_info_mapping0 *info=(vorbis_info_mapping0 *)l;

  int                   i,j;
  long                  n=vb->pcmend=ci->blocksizes[vb->W];

  float **pcmbundle=alloca(sizeof(*pcmbundle)*vi->channels);
  int    *zerobundle=alloca(sizeof(*zerobundle)*vi->channels);

  int   *nonzero  =alloca(sizeof(*nonzero)*vi->channels);
  void **floormemo=alloca(sizeof(*floormemo)*vi->channels);

  /* recover the spectral envelope; store it in the PCM vector for now */
  for(i=0;i<vi->channels;i++){
    int submap=info->chmuxlist[i];
    floormemo[i]=_floor_P[ci->floor_type[info->floorsubmap[submap]]]->
      inverse1(vb,b->flr[info->floorsubmap[submap]]);
    if(floormemo[i])
      nonzero[i]=1;
    else
      nonzero[i]=0;
    memset(vb->pcm[i],0,sizeof(*vb->pcm[i])*n/2);
  }

  /* channel coupling can 'dirty' the nonzero listing */
  for(i=0;i<info->coupling_steps;i++){
    if(nonzero[info->coupling_mag[i]] ||
       nonzero[info->coupling_ang[i]]){
      nonzero[info->coupling_mag[i]]=1;
      nonzero[info->coupling_ang[i]]=1;
    }
  }

  /* recover the residue into our working vectors */
  for(i=0;i<info->submaps;i++){
    int ch_in_bundle=0;
    for(j=0;j<vi->channels;j++){
      if(info->chmuxlist[j]==i){
        if(nonzero[j])
          zerobundle[ch_in_bundle]=1;
        else
          zerobundle[ch_in_bundle]=0;
        pcmbundle[ch_in_bundle++]=vb->pcm[j];
      }
    }

    _residue_P[ci->residue_type[info->residuesubmap[i]]]->
      inverse(vb,b->residue[info->residuesubmap[i]],
              pcmbundle,zerobundle,ch_in_bundle);
  }

  /* channel coupling */
  for(i=info->coupling_steps-1;i>=0;i--){
    float *pcmM=vb->pcm[info->coupling_mag[i]];
    float *pcmA=vb->pcm[info->coupling_ang[i]];

    for(j=0;j<n/2;j++){
      float mag=pcmM[j];
      float ang=pcmA[j];

      if(mag>0)
        if(ang>0){
          pcmM[j]=mag;
          pcmA[j]=mag-ang;
        }else{
          pcmA[j]=mag;
          pcmM[j]=mag+ang;
        }
      else
        if(ang>0){
          pcmM[j]=mag;
          pcmA[j]=mag+ang;
        }else{
          pcmA[j]=mag;
          pcmM[j]=mag-ang;
        }
    }
  }

  /* compute and apply spectral envelope */
  for(i=0;i<vi->channels;i++){
    float *pcm=vb->pcm[i];
    int submap=info->chmuxlist[i];
    _floor_P[ci->floor_type[info->floorsubmap[submap]]]->
      inverse2(vb,b->flr[info->floorsubmap[submap]],
               floormemo[i],pcm);
  }

  /* transform the PCM data; takes PCM vector, vb; modifies PCM vector */
  /* only MDCT right now.... */
  for(i=0;i<vi->channels;i++){
    float *pcm=vb->pcm[i];
    mdct_backward(b->transform[vb->W][0],pcm,pcm);
  }

  /* all done! */
  return(0);
}